

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainILR.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  AST ast;
  string filename;
  AST local_70;
  string local_68 [32];
  string local_48;
  string local_28;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Hello, World!");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"vbn/tim.cpp",(allocator<char> *)&local_70);
  std::__cxx11::string::string((string *)&local_28,local_68);
  AST::AST(&local_70,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::assign((char *)local_68);
  std::__cxx11::string::string((string *)&local_48,local_68);
  AST::toDot(&local_70,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string(local_68);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    std::cout << "Hello, World!" << std::endl;

    std::string filename = "vbn/tim.cpp";
    AST ast(filename);

    filename = "output/parsed.dot";
    ast.toDot(filename);
}